

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf2.c
# Opt level: O0

double time_op(int g_a,double *buf_,int chunk,int loop,int proc,int ndim,int op)

{
  int in_ECX;
  int in_R9D;
  double dVar1;
  int in_stack_00000008;
  double alpha;
  double *buf;
  int *in_stack_00000020;
  int bal;
  int i;
  int ld;
  int hi [2];
  int lo [2];
  double total_time;
  double stop_time;
  double start_time;
  undefined4 in_stack_00000070;
  int *in_stack_00000078;
  int in_stack_00000084;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_50;
  double local_38;
  
  NGA_Distribution(hi[1],hi[0],_i,in_stack_00000020);
  if ((in_R9D != 1) && (in_R9D != 2)) {
    GA_Error((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff8c);
  }
  dVar1 = armci_timer();
  for (local_50 = 0; local_50 < in_ECX; local_50 = local_50 + 1) {
    if (in_stack_00000008 == 0) {
      NGA_Get(in_stack_00000084,in_stack_00000078,(int *)CONCAT44(g_a,in_stack_00000070),buf_,
              (int *)CONCAT44(chunk,loop));
    }
    else if (in_stack_00000008 == 1) {
      NGA_Put(in_stack_00000084,in_stack_00000078,(int *)CONCAT44(g_a,in_stack_00000070),buf_,
              (int *)CONCAT44(chunk,loop));
    }
    else if (in_stack_00000008 == 2) {
      NGA_Acc(in_stack_00000084,in_stack_00000078,(int *)CONCAT44(g_a,in_stack_00000070),buf_,
              (int *)CONCAT44(chunk,loop),(void *)CONCAT44(proc,ndim));
    }
    else {
      GA_Error((char *)CONCAT44(in_stack_00000008,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c);
    }
  }
  local_38 = armci_timer();
  local_38 = local_38 - dVar1;
  if ((local_38 == 0.0) && (!NAN(local_38))) {
    local_38 = 1e-06;
    warn_accuracy = warn_accuracy + 1;
  }
  return local_38 / (double)in_ECX;
}

Assistant:

double time_op(int g_a, double *buf_, int chunk, int loop, int proc,
               int ndim, int op)
{
  double start_time = 0;
  double stop_time = 0;
  double total_time = 0;
  int lo[2] = {-1,-1};
  int hi[2] = {-1,-1};
  int ld = -1;
  int i = 0;
  int bal = 0;
  double *buf = buf_;
  double alpha = 1;

  /* get the location within the g_a for the given proc */
  NGA_Distribution(g_a, proc, lo, hi);
  /* determine how much data to grab based on the chunk and dimensionality */
  if (ndim == 1) {
    hi[0] = lo[0] + chunk*chunk - 1;
  }
  else if (ndim == 2) {
    hi[0] = lo[0] + chunk - 1;
    hi[1] = lo[1] + chunk - 1;
    ld = chunk;
  }
  else {
    GA_Error("invalid ndim for time_op", ndim);
  }

  start_time = TIMER();
  for (i=0; i<loop; ++i) {
    switch (op) {
      case OP_GET:
        NGA_Get(g_a, lo, hi, buf, &ld);
        break;
      case OP_PUT:
        NGA_Put(g_a, lo, hi, buf, &ld);
        break;
      case OP_ACC:
        NGA_Acc(g_a, lo, hi, buf, &ld, &alpha);
        break;
      default:
        GA_Error("bad case value for op", op);
    }
    /* prepare next src location and dst ptr: avoid cache locality */
    if (bal == 0) {
      lo[0] += 128;
      lo[1] += 128;
      hi[0] += 128;
      hi[1] += 128;
      buf += 128;
      bal = 1;
    }
    else {
      lo[0] -= 128;
      lo[1] -= 128;
      hi[0] -= 128;
      hi[1] -= 128;
      buf -= 128;
      bal = 0;
    }
  }
  stop_time = TIMER();
  total_time = (stop_time - start_time);
  if (total_time == 0.0) {
    total_time = 0.000001; /* workaround for inaccurate timers */
    warn_accuracy++;
  }

  return(total_time / loop);
}